

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void ReadArray<aiVectorKey>(IOStream *stream,aiVectorKey *out,uint size)

{
  double *pdVar1;
  long lVar2;
  undefined1 local_40 [16];
  float local_30;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVectorKey]");
  }
  if (out != (aiVectorKey *)0x0) {
    for (lVar2 = 0; (ulong)size * 0x18 - lVar2 != 0; lVar2 = lVar2 + 0x18) {
      Read<aiVectorKey>((aiVectorKey *)local_40,stream);
      *(float *)((long)&(out->mValue).z + lVar2) = local_30;
      pdVar1 = (double *)((long)&out->mTime + lVar2);
      *pdVar1 = (double)local_40._0_8_;
      pdVar1[1] = (double)local_40._8_8_;
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVectorKey]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}